

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O3

array_t<float,_16> __thiscall
pybind11::array_t<float,_16>::ensure(array_t<float,_16> *this,handle h)

{
  PyObject *pPVar1;
  
  pPVar1 = raw_array_t(h.m_ptr);
  (this->super_array).super_buffer.super_object.super_handle.m_ptr = pPVar1;
  if (pPVar1 == (PyObject *)0x0) {
    PyErr_Clear();
  }
  return (array)(array)this;
}

Assistant:

static array_t ensure(handle h) {
        auto result = reinterpret_steal<array_t>(raw_array_t(h.ptr()));
        if (!result) {
            PyErr_Clear();
        }
        return result;
    }